

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QStringList * __thiscall QCommandLineParser::positionalArguments(QCommandLineParser *this)

{
  QCommandLineParserPrivate *in_RSI;
  QStringList *in_RDI;
  QStringList *this_00;
  
  this_00 = in_RDI;
  QCommandLineParserPrivate::checkParsed(in_RSI,(char *)0x6f2ec7);
  QList<QString>::QList(this_00,(QList<QString> *)in_RSI);
  return in_RDI;
}

Assistant:

QStringList QCommandLineParser::positionalArguments() const
{
    d->checkParsed("positionalArguments");
    return d->positionalArgumentList;
}